

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O2

ggml_cgraph * gpt2_graph(gpt2_model *model,int n_past,vector<int,_std::allocator<int>_> *embd_inp)

{
  pointer piVar1;
  pointer piVar2;
  ggml_tensor *pgVar3;
  ggml_cgraph *pgVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  long local_100;
  long local_f8;
  int32_t v;
  long local_e8;
  ulong local_e0;
  long local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  undefined8 local_b8;
  long local_b0;
  float local_a4;
  ggml_cgraph *local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  undefined8 local_68;
  ulong local_60;
  long local_58;
  long local_50;
  size_t local_48;
  pointer puStack_40;
  undefined1 local_38;
  
  piVar1 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar2 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  local_d0 = (ulong)(model->hparams).n_embd;
  local_e0 = (ulong)(uint)(model->hparams).n_layer;
  local_c8 = (long)(model->hparams).n_ctx;
  local_98 = (long)(model->hparams).n_head;
  if (gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)::buf_size == '\0'
     ) {
    iVar5 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                                 ::buf_size);
    if (iVar5 != 0) {
      lVar7 = ggml_tensor_overhead();
      lVar13 = ggml_graph_overhead_custom(0x1000,0);
      gpt2_graph::buf_size = lVar13 + lVar7 * 0x1000;
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                           ::buf_size);
    }
  }
  if (gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)::buf == '\0') {
    iVar5 = __cxa_guard_acquire(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                                 ::buf);
    if (iVar5 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&gpt2_graph::buf,gpt2_graph::buf_size,(allocator_type *)&v);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &gpt2_graph::buf,&__dso_handle);
      __cxa_guard_release(&gpt2_graph(gpt2_model_const&,int,std::vector<int,std::allocator<int>>const&)
                           ::buf);
    }
  }
  uVar11 = (ulong)((long)piVar1 - (long)piVar2) >> 2;
  local_48 = gpt2_graph::buf_size;
  puStack_40 = gpt2_graph::buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  local_38 = 1;
  uVar6 = ggml_init();
  lVar14 = 0;
  local_a0 = (ggml_cgraph *)ggml_new_graph_custom(uVar6,0x1000,0);
  iVar5 = (int)uVar11;
  lVar13 = (long)iVar5;
  local_d8 = ggml_view_1d(uVar6,model->embd,lVar13,0);
  pgVar3 = model->embd;
  piVar1 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar7 = ggml_element_size(local_d8);
  ggml_backend_tensor_set(pgVar3,piVar1,0,lVar7 * lVar13);
  local_e8 = ggml_view_1d(uVar6,model->position,lVar13,0);
  uVar12 = 0;
  if (0 < iVar5) {
    uVar12 = uVar11 & 0xffffffff;
  }
  iVar15 = n_past;
  local_b0 = lVar13;
  for (; uVar12 * 4 != lVar14; lVar14 = lVar14 + 4) {
    v = iVar15;
    ggml_backend_tensor_set(model->position,&v,lVar14,4);
    iVar15 = iVar15 + 1;
  }
  fVar16 = (float)(model->hparams).n_embd / (float)(model->hparams).n_head;
  if (fVar16 < 0.0) {
    fVar16 = sqrtf(fVar16);
  }
  else {
    fVar16 = SQRT(fVar16);
  }
  local_a4 = 1.0 / fVar16;
  uVar8 = ggml_get_rows(uVar6,model->wte,local_d8);
  uVar9 = ggml_get_rows(uVar6,model->wpe,local_e8);
  lVar7 = ggml_add(uVar6,uVar8,uVar9);
  ggml_set_name(lVar7,"inpL");
  ggml_set_name(*(undefined8 *)(lVar7 + 0x98),"wte");
  ggml_set_name(*(undefined8 *)(lVar7 + 0xa0),"wpe");
  local_78 = local_d0 * 4;
  local_80 = local_d0 * 8;
  local_90 = (long)((int)local_d0 * iVar5);
  local_d8 = (long)(iVar5 + n_past);
  uVar11 = local_e0 & 0xffffffff;
  if ((int)local_e0 < 1) {
    uVar11 = 0;
  }
  local_e0 = (ulong)((iVar5 + n_past) * (int)local_d0);
  local_70 = uVar11 * 0x60;
  local_f8 = (long)n_past * local_d0;
  local_88 = local_c8 * local_d0;
  lVar13 = 0;
  local_e8 = 0;
  uVar11 = 0;
  while( true ) {
    local_50 = lVar7;
    uVar8 = ggml_norm((model->hparams).eps,uVar6,lVar7);
    if (local_70 == lVar13) break;
    ggml_format_name(uVar8,"l%d.norm",uVar11 & 0xffffffff);
    uVar8 = ggml_mul(uVar6,uVar8,
                     *(undefined8 *)
                      ((long)&((model->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->ln_1_g + lVar13));
    lVar7 = ggml_add(uVar6,uVar8,
                     *(undefined8 *)
                      ((long)&((model->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->ln_1_b + lVar13));
    ggml_format_name(lVar7,"l%d.ln_1_b",uVar11 & 0xffffffff);
    ggml_format_name(*(undefined8 *)(lVar7 + 0x98),"l%d.ln_1_g",uVar11 & 0xffffffff);
    uVar8 = ggml_mul_mat(uVar6,*(undefined8 *)
                                ((long)&((model->layers).
                                         super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->c_attn_attn_w +
                                lVar13),lVar7);
    ggml_format_name(uVar8,"l%d.attn_w",uVar11 & 0xffffffff);
    local_58 = lVar13;
    lVar13 = ggml_add(uVar6,uVar8,
                      *(undefined8 *)
                       ((long)&((model->layers).
                                super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                                super__Vector_impl_data._M_start)->c_attn_attn_b + lVar13));
    ggml_format_name(lVar13,"l%d.attn_b",uVar11 & 0xffffffff);
    lVar7 = local_b0;
    uVar12 = local_d0;
    uVar8 = ggml_view_2d(uVar6,lVar13,local_d0,local_b0,*(undefined8 *)(lVar13 + 0x38),0);
    local_60 = uVar11;
    uVar9 = ggml_view_2d(uVar6,lVar13,uVar12,lVar7,*(undefined8 *)(lVar13 + 0x38),local_78);
    uVar10 = ggml_view_2d(uVar6,lVar13,uVar12,lVar7,*(undefined8 *)(lVar13 + 0x38),local_80);
    uVar11 = local_60;
    local_b8 = uVar8;
    ggml_format_name(uVar8,"l%d.Qcur",local_60 & 0xffffffff);
    local_c0 = uVar9;
    ggml_format_name(uVar9,"l%d.Kcur",uVar11 & 0xffffffff);
    ggml_format_name(uVar10,"l%d.Vcur",uVar11 & 0xffffffff);
    local_100 = local_e8;
    if (0 < (int)lVar7) {
      pgVar3 = model->memory_k;
      lVar13 = ggml_element_size(pgVar3);
      lVar7 = local_90;
      local_100 = uVar11 * local_c8;
      uVar8 = ggml_view_1d(uVar6,pgVar3,local_90,lVar13 * local_f8);
      pgVar3 = model->memory_v;
      local_68 = uVar10;
      lVar13 = ggml_element_size(pgVar3);
      uVar9 = ggml_view_1d(uVar6,pgVar3,lVar7,lVar13 * local_f8);
      uVar8 = ggml_cpy(uVar6,local_c0,uVar8);
      pgVar4 = local_a0;
      ggml_build_forward_expand(local_a0,uVar8);
      uVar8 = ggml_cpy(uVar6,local_68,uVar9);
      ggml_build_forward_expand(pgVar4,uVar8);
    }
    lVar7 = local_98;
    uVar12 = local_d0;
    local_c0 = (long)(int)((long)((ulong)(uint)((int)local_d0 >> 0x1f) << 0x20 |
                                 local_d0 & 0xffffffff) / (long)(int)local_98);
    uVar8 = ggml_cont_3d(uVar6,local_b8,local_c0,local_98,local_b0);
    local_b8 = ggml_permute(uVar6,uVar8,0,2,1,3);
    ggml_format_name(local_b8,"l%d.Q",uVar11 & 0xffffffff);
    pgVar3 = model->memory_k;
    lVar13 = ggml_element_size(pgVar3);
    uVar8 = ggml_view_1d(uVar6,pgVar3,local_e0,lVar13 * local_100 * uVar12);
    lVar13 = local_c0;
    uVar8 = ggml_reshape_3d(uVar6,uVar8,local_c0,lVar7,local_d8);
    uVar8 = ggml_permute(uVar6,uVar8,0,2,1,3);
    ggml_format_name(uVar8,"l%d.K",uVar11 & 0xffffffff);
    uVar8 = ggml_mul_mat(uVar6,uVar8,local_b8);
    ggml_format_name(uVar8,"l%d.KQ",uVar11 & 0xffffffff);
    uVar8 = ggml_scale(local_a4,uVar6,uVar8);
    ggml_format_name(uVar8,"l%d.KQ_scaled",uVar11 & 0xffffffff);
    uVar8 = ggml_diag_mask_inf(uVar6,uVar8,n_past);
    ggml_format_name(uVar8,"l%d.KQ_masked",uVar11 & 0xffffffff);
    uVar8 = ggml_soft_max(uVar6,uVar8);
    ggml_format_name(uVar8,"l%d.KQ_soft_max",uVar11 & 0xffffffff);
    pgVar3 = model->memory_v;
    lVar7 = ggml_element_size(pgVar3);
    uVar9 = ggml_view_1d(uVar6,pgVar3,local_e0,local_100 * uVar12 * lVar7);
    lVar14 = local_98;
    lVar7 = local_d8;
    uVar9 = ggml_reshape_3d(uVar6,uVar9,lVar13,local_98,local_d8);
    uVar9 = ggml_permute(uVar6,uVar9,1,2,0,3);
    uVar9 = ggml_cont_3d(uVar6,uVar9,lVar7,lVar13,lVar14);
    uVar8 = ggml_mul_mat(uVar6,uVar9,uVar8);
    ggml_format_name(uVar8,"l%d.KQV",uVar11 & 0xffffffff);
    uVar8 = ggml_permute(uVar6,uVar8,0,2,1);
    ggml_format_name(uVar8,"l%d.KQV_merged",uVar11 & 0xffffffff);
    uVar8 = ggml_cont_2d(uVar6,uVar8,local_d0,local_b0);
    ggml_format_name(uVar8,"l%d.KQV_merged_contiguous",uVar11 & 0xffffffff);
    lVar13 = local_58;
    uVar8 = ggml_mul_mat(uVar6,*(undefined8 *)
                                ((long)&((model->layers).
                                         super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->c_attn_proj_w +
                                local_58),uVar8);
    ggml_format_name(uVar8,"l%d.attn_proj_w",uVar11 & 0xffffffff);
    uVar8 = ggml_add(uVar6,uVar8,
                     *(undefined8 *)
                      ((long)&((model->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->c_attn_proj_b + lVar13));
    ggml_format_name(uVar8,"l%d.attn_proj_b",uVar11 & 0xffffffff);
    uVar8 = ggml_add(uVar6,uVar8,local_50);
    ggml_format_name(uVar8,"l%d.add",uVar11 & 0xffffffff);
    uVar9 = ggml_norm((model->hparams).eps,uVar6,uVar8);
    ggml_format_name(uVar9,"l%d.FFnorm",uVar11 & 0xffffffff);
    uVar9 = ggml_mul(uVar6,uVar9,
                     *(undefined8 *)
                      ((long)&((model->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->ln_2_g + lVar13));
    lVar7 = ggml_add(uVar6,uVar9,
                     *(undefined8 *)
                      ((long)&((model->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->ln_2_b + lVar13));
    ggml_format_name(lVar7,"l%d.ln_2_b",uVar11 & 0xffffffff);
    ggml_format_name(*(undefined8 *)(lVar7 + 0x98),"l%d.ln_2_g",uVar11 & 0xffffffff);
    uVar9 = ggml_mul_mat(uVar6,*(undefined8 *)
                                ((long)&((model->layers).
                                         super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->c_mlp_fc_w +
                                lVar13),lVar7);
    ggml_format_name(uVar9,"l%d.mlp_fc_w",uVar11 & 0xffffffff);
    uVar9 = ggml_add(uVar6,uVar9,
                     *(undefined8 *)
                      ((long)&((model->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->c_mlp_fc_b + lVar13));
    ggml_format_name(uVar9,"l%d.mlp_fc_b",uVar11 & 0xffffffff);
    uVar9 = ggml_gelu(uVar6,uVar9);
    ggml_format_name(uVar9,"l%d.gelu",uVar11 & 0xffffffff);
    uVar9 = ggml_mul_mat(uVar6,*(undefined8 *)
                                ((long)&((model->layers).
                                         super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->c_mlp_proj_w +
                                lVar13),uVar9);
    ggml_format_name(uVar9,"l%d.mlp_proj_w",uVar11 & 0xffffffff);
    uVar9 = ggml_add(uVar6,uVar9,
                     *(undefined8 *)
                      ((long)&((model->layers).
                               super__Vector_base<gpt2_layer,_std::allocator<gpt2_layer>_>._M_impl.
                               super__Vector_impl_data._M_start)->c_mlp_proj_b + lVar13));
    ggml_format_name(uVar9,"l%d.mlp_proj_b",uVar11 & 0xffffffff);
    lVar7 = ggml_add(uVar6,uVar9,uVar8);
    ggml_format_name(lVar7,"l%d.add2",uVar11 & 0xffffffff);
    uVar11 = uVar11 + 1;
    local_e8 = local_e8 + local_c8;
    lVar13 = lVar13 + 0x60;
    local_f8 = local_f8 + local_88;
  }
  ggml_format_name(uVar8,"out_norm");
  uVar8 = ggml_mul(uVar6,uVar8,model->ln_f_g);
  lVar7 = ggml_add(uVar6,uVar8,model->ln_f_b);
  ggml_format_name(lVar7,"out_ln_f_b");
  ggml_format_name(*(undefined8 *)(lVar7 + 0x98),"out_ln_f_g");
  uVar8 = ggml_mul_mat(uVar6,model->lm_head,lVar7);
  ggml_format_name(uVar8,"out_lm_head");
  pgVar4 = local_a0;
  ggml_build_forward_expand(local_a0,uVar8);
  ggml_free(uVar6);
  return pgVar4;
}

Assistant:

struct ggml_cgraph * gpt2_graph(
        const gpt2_model & model,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_embd  = hparams.n_embd;
    const int n_layer = hparams.n_layer;
    const int n_ctx   = hparams.n_ctx;
    const int n_head  = hparams.n_head;

    // since we are using ggml-alloc, this buffer only needs enough space to hold the ggml_tensor and ggml_cgraph structs, but not the tensor data
    static size_t buf_size = ggml_tensor_overhead()*GPT2_MAX_NODES + ggml_graph_overhead_custom(GPT2_MAX_NODES, false);
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_gallocr_alloc_graph()
    };

    struct ggml_context * ctx = ggml_init(params);

    struct ggml_cgraph  * gf = ggml_new_graph_custom(ctx, GPT2_MAX_NODES, false);

    struct ggml_tensor * embd = ggml_view_1d(ctx, model.embd, N, 0);

    // set inputs
    // TODO: move to gpt2_eval
    ggml_backend_tensor_set(model.embd, embd_inp.data(), 0, N*ggml_element_size(embd));

    struct ggml_tensor * position = ggml_view_1d(ctx, model.position, N, 0);
    for (int i = 0; i < N; ++i) {
        int32_t v = n_past + i;
        ggml_backend_tensor_set(model.position, &v, i*sizeof(int32_t), sizeof(v));
    }

    const float KQ_scale = 1.0f/sqrtf(float(model.hparams.n_embd)/model.hparams.n_head);

    // wte + wpe
    struct ggml_tensor * inpL =
        ggml_add(ctx,
                ggml_get_rows(ctx, model.wte, embd),
                ggml_get_rows(ctx, model.wpe, position));
    ggml_set_name(inpL, "inpL");
    ggml_set_name(inpL->src[0], "wte");
    ggml_set_name(inpL->src[1], "wpe");

    for (int il = 0; il < n_layer; ++il) {
        struct ggml_tensor * cur;

        // norm
        {
            // [ 768, N]
            cur = ggml_norm(ctx, inpL, hparams.eps);
            ggml_format_name(cur, "l%d.norm", il);

            // cur = ln_1_g*cur + ln_1_b
            // [ 768, N]
            cur = ggml_add(ctx,
                    ggml_mul(ctx,
                        cur,
                        model.layers[il].ln_1_g),
                    model.layers[il].ln_1_b);
            ggml_format_name(cur, "l%d.ln_1_b", il);
            ggml_format_name(cur->src[0], "l%d.ln_1_g", il);
        }

        // attn
        // [2304, 768] - model.layers[il].c_attn_attn_w
        // [2304,   1] - model.layers[il].c_attn_attn_b
        // [ 768,   N] - cur (in)
        // [2304,   N] - cur (out)
        //
        // cur = attn_w*cur + attn_b
        // [2304, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_attn_w,
                    cur);
            ggml_format_name(cur, "l%d.attn_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_attn_b);
            ggml_format_name(cur, "l%d.attn_b", il);
        }

        // self-attention
        {
            struct ggml_tensor * Qcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 0*sizeof(float)*n_embd);
            struct ggml_tensor * Kcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 1*sizeof(float)*n_embd);
            struct ggml_tensor * Vcur = ggml_view_2d(ctx, cur, n_embd, N, cur->nb[1], 2*sizeof(float)*n_embd);

            ggml_format_name(Qcur, "l%d.Qcur", il);
            ggml_format_name(Kcur, "l%d.Kcur", il);
            ggml_format_name(Vcur, "l%d.Vcur", il);

            // store key and value to memory
            if (N >= 1) {
                struct ggml_tensor * k = ggml_view_1d(ctx, model.memory_k, N*n_embd, (ggml_element_size(model.memory_k)*n_embd)*(il*n_ctx + n_past));
                struct ggml_tensor * v = ggml_view_1d(ctx, model.memory_v, N*n_embd, (ggml_element_size(model.memory_v)*n_embd)*(il*n_ctx + n_past));

                ggml_build_forward_expand(gf, ggml_cpy(ctx, Kcur, k));
                ggml_build_forward_expand(gf, ggml_cpy(ctx, Vcur, v));
            }

            // Q = Qcur.contiguous().view(n_embd/n_head, n_head, N).permute(0, 2, 1, 3)
            // [64, N, 12]
            struct ggml_tensor * Q =
                ggml_permute(ctx,
                        ggml_cont_3d(ctx, Qcur, n_embd/n_head, n_head, N),
                        0, 2, 1, 3);
            ggml_format_name(Q, "l%d.Q", il);

            // K = Kmem.view(n_embd/n_head, n_head, n_past + N).permute(0, 2, 1, 3)
            // [64, n_past + N, 12]
            struct ggml_tensor * K =
                ggml_permute(ctx,
                        ggml_reshape_3d(ctx,
                            ggml_view_1d(ctx, model.memory_k, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_k)*n_embd),
                            n_embd/n_head, n_head, n_past + N),
                        0, 2, 1, 3);
            ggml_format_name(K, "l%d.K", il);

            // GG: flash attention
            //struct ggml_tensor * V =
            //    ggml_cpy(ctx0,
            //            ggml_permute(ctx0,
            //                ggml_reshape_3d(ctx0,
            //                    ggml_view_1d(ctx0, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
            //                    n_embd/n_head, n_head, n_past + N),
            //                1, 2, 0, 3),
            //            ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, n_past + N, n_embd/n_head, n_head));

            //struct ggml_tensor * KQV = ggml_flash_attn(ctx0, Q, K, V, true);

            // K * Q
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ = ggml_mul_mat(ctx, K, Q);
            ggml_format_name(KQ, "l%d.KQ", il);

            // KQ_scaled = KQ / sqrt(n_embd/n_head)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_scaled = ggml_scale(ctx, KQ, KQ_scale);
            ggml_format_name(KQ_scaled, "l%d.KQ_scaled", il);

            // KQ_masked = mask_past(KQ_scaled)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_masked = ggml_diag_mask_inf(ctx, KQ_scaled, n_past);
            ggml_format_name(KQ_masked, "l%d.KQ_masked", il);

            // KQ = soft_max(KQ_masked)
            // [n_past + N, N, 12]
            struct ggml_tensor * KQ_soft_max = ggml_soft_max(ctx, KQ_masked);
            ggml_format_name(KQ_soft_max, "l%d.KQ_soft_max", il);

            // V_trans = Vmem.view(n_embd/n_head, n_head, n_past + N).permute(1, 2, 0, 3).contiguous()
            // [n_past + N, 64, 12]
            struct ggml_tensor * V_trans =
                ggml_cont_3d(ctx,
                        ggml_permute(ctx,
                            ggml_reshape_3d(ctx,
                                ggml_view_1d(ctx, model.memory_v, (n_past + N)*n_embd, il*n_ctx*ggml_element_size(model.memory_v)*n_embd),
                                n_embd/n_head, n_head, n_past + N),
                            1, 2, 0, 3),
                        n_past + N, n_embd/n_head, n_head);

            // KQV = transpose(V) * KQ_soft_max
            // [64, N, 12]
            struct ggml_tensor * KQV = ggml_mul_mat(ctx, V_trans, KQ_soft_max);
            ggml_format_name(KQV, "l%d.KQV", il);

            // KQV_merged = KQV.permute(0, 2, 1, 3)
            // [64, 12, N]
            struct ggml_tensor * KQV_merged = ggml_permute(ctx, KQV, 0, 2, 1, 3);
            ggml_format_name(KQV_merged, "l%d.KQV_merged", il);

            // cur = KQV_merged.contiguous().view(n_embd, N)
            // [768, N]
            cur = ggml_cont_2d(ctx, KQV_merged, n_embd, N);
            ggml_format_name(cur, "l%d.KQV_merged_contiguous", il);
        }

        // projection
        // [ 768, 768] - model.layers[il].c_attn_proj_w
        // [ 768,   1] - model.layers[il].c_attn_proj_b
        // [ 768,   N] - cur (in)
        // [ 768,   N] - cur (out)
        //
        // cur = proj_w*cur + proj_b
        // [768, N]
        {
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_attn_proj_w,
                    cur);
            ggml_format_name(cur, "l%d.attn_proj_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_attn_proj_b);
            ggml_format_name(cur, "l%d.attn_proj_b", il);
        }

        // add the input
        cur = ggml_add(ctx, cur, inpL);
        ggml_format_name(cur, "l%d.add", il);

        struct ggml_tensor * inpFF = cur;

        // feed-forward network
        {
            // norm
            {
                cur = ggml_norm(ctx, inpFF, hparams.eps);
                ggml_format_name(cur, "l%d.FFnorm", il);

                // cur = ln_2_g*cur + ln_2_b
                // [ 768, N]
                cur = ggml_add(ctx,
                        ggml_mul(ctx,
                            cur,
                            model.layers[il].ln_2_g),
                        model.layers[il].ln_2_b);
                ggml_format_name(cur, "l%d.ln_2_b", il);
                ggml_format_name(cur->src[0], "l%d.ln_2_g", il);
            }

            // fully connected
            // [3072, 768] - model.layers[il].c_mlp_fc_w
            // [3072,   1] - model.layers[il].c_mlp_fc_b
            // [ 768,   N] - cur (in)
            // [3072,   N] - cur (out)
            //
            // cur = fc_w*cur + fc_b
            // [3072, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_fc_w,
                    cur);
            ggml_format_name(cur, "l%d.mlp_fc_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_fc_b);
            ggml_format_name(cur, "l%d.mlp_fc_b", il);

            // GELU activation
            // [3072, N]
            cur = ggml_gelu(ctx, cur);
            ggml_format_name(cur, "l%d.gelu", il);

            // projection
            // [ 768, 3072] - model.layers[il].c_mlp_proj_w
            // [ 768,    1] - model.layers[il].c_mlp_proj_b
            // [3072,    N] - cur (in)
            // [ 768,    N] - cur (out)
            //
            // cur = proj_w*cur + proj_b
            // [768, N]
            cur = ggml_mul_mat(ctx,
                    model.layers[il].c_mlp_proj_w,
                    cur);
            ggml_format_name(cur, "l%d.mlp_proj_w", il);

            cur = ggml_add(ctx,
                    cur,
                    model.layers[il].c_mlp_proj_b);
            ggml_format_name(cur, "l%d.mlp_proj_b", il);
        }

        // input for next layer
        inpL = ggml_add(ctx, cur, inpFF);
        ggml_format_name(inpL, "l%d.add2", il);
    }

    // norm
    {
        // [ 768, N]
        inpL = ggml_norm(ctx, inpL, hparams.eps);
        ggml_format_name(inpL, "out_norm");

        // inpL = ln_f_g*inpL + ln_f_b
        // [ 768, N]
        inpL = ggml_add(ctx,
                ggml_mul(ctx,
                    inpL,
                    model.ln_f_g),
                model.ln_f_b);
        ggml_format_name(inpL, "out_ln_f_b");
        ggml_format_name(inpL->src[0], "out_ln_f_g");
    }

    // inpL = WTE * inpL
    // [ 768, 50257] - model.lm_head
    // [ 768, N]     - inpL
    inpL = ggml_mul_mat(ctx, model.lm_head, inpL);
    ggml_format_name(inpL, "out_lm_head");

    // logits -> probs
    //inpL = ggml_soft_max(ctx0, inpL);

    ggml_build_forward_expand(gf, inpL);

    ggml_free(ctx);

    return gf;
}